

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindSuchRecord
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  _Rb_tree_header *p_Var1;
  Addr p;
  vector<condition,_std::allocator<condition>_> *this_00;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  reference pvVar5;
  _Base_ptr p_Var6;
  ulong __n;
  key_type local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string filename;
  Record R;
  condition local_98;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  Record::Record(&R);
  std::operator+(&local_130,&this->Direction,&S->tableName);
  std::operator+(&filename,&local_130,"_rcd.dat");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_150,(string *)&filename);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>_>
          ::find(&(this->Total_Record)._M_t,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  p_Var6 = (ps->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(ps->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::~string((string *)&filename);
      Record::~Record(&R);
      return __return_storage_ptr__;
    }
    p.BlockNum = p_Var6[1]._M_color;
    p.FileOff = *(int *)&p_Var6[1].field_0x4;
    iVar3 = RecordSet::FindRecord((RecordSet *)(iVar4._M_node + 2),p,&R);
    if (iVar3 == 1) {
      __n = 0;
      do {
        this_00 = S->c_list;
        if ((ulong)(((long)(this_00->super__Vector_base<condition,_std::allocator<condition>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->super__Vector_base<condition,_std::allocator<condition>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x68) <= __n) {
          std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
          _M_insert_unique<Addr_const&>
                    ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                      *)__return_storage_ptr__,(Addr *)(p_Var6 + 1));
          break;
        }
        pvVar5 = std::vector<condition,_std::allocator<condition>_>::at(this_00,__n);
        condition::condition(&local_98,pvVar5);
        bVar2 = Record::Check(&R,&local_98);
        condition::~condition(&local_98);
        __n = __n + 1;
      } while (bVar2);
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

set<Addr> RecordManager::FindSuchRecord(STMT S, set<Addr>ps) {
	set<Addr> ans;
	set<Addr>::iterator it;
	Record R;
	string filename = Direction + S.tableName + "_rcd.dat";
	RecordSet& RS = this->FindRecordSet(filename);
	for (it = ps.begin(); it != ps.end(); it++) {
		int Found = RS.FindRecord(*it, R);
		if (Found != 1)
			continue;				//�õ�ַ�ϵļ�¼��Ч��ֱ�Ӽ����һ��
		else {
			bool flag = true;
			int i;
			for (i = 0; i < S.c_list->size(); i++) {
				if (R.Check(S.c_list->at(i)) == false) {
					flag = false;	//����һ�����������㣬ֱ����̭
					break;
				}
			}
			if (flag == true) {
				ans.insert(*it);		//�������������ģ������ַ������������
			}
		}
	}
	return ans;
}